

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O1

void __thiscall CVmObjLookupTable::mark_refs(CVmObjLookupTable *this,uint state)

{
  uint uVar1;
  ulong uVar2;
  int *piVar3;
  uint *puVar4;
  
  puVar4 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  if (puVar4[4] == 5) {
    uVar1 = puVar4[6];
    CVmObjTable::add_to_gc_queue
              (&G_obj_table_X,uVar1,
               (CVmObjPageEntry *)
               ((long)&G_obj_table_X.pages_[uVar1 >> 0xc]->ptr_ + (ulong)((uVar1 & 0xfff) * 0x18)),
               state);
  }
  uVar2 = (ulong)*puVar4;
  if (uVar2 != 0) {
    puVar4 = puVar4 + 8;
    do {
      for (piVar3 = *(int **)puVar4; piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 8)) {
        if (*piVar3 == 5) {
          uVar1 = piVar3[2];
          CVmObjTable::add_to_gc_queue
                    (&G_obj_table_X,uVar1,
                     (CVmObjPageEntry *)
                     ((long)&G_obj_table_X.pages_[uVar1 >> 0xc]->ptr_ +
                     (ulong)((uVar1 & 0xfff) * 0x18)),state);
        }
        if (piVar3[4] == 5) {
          uVar1 = piVar3[6];
          CVmObjTable::add_to_gc_queue
                    (&G_obj_table_X,uVar1,
                     (CVmObjPageEntry *)
                     ((long)&G_obj_table_X.pages_[uVar1 >> 0xc]->ptr_ +
                     (ulong)((uVar1 & 0xfff) * 0x18)),state);
        }
      }
      puVar4 = puVar4 + 2;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void CVmObjLookupTable::mark_refs(VMG_ uint state)
{
    /* get my extension */
    vm_lookup_ext *ext = get_ext();

    /* mark the default value */
    const vm_val_t *val = &ext->default_value;
    if (val->typ == VM_OBJ)
        G_obj_table->mark_all_refs(val->val.obj, state);

    /* run through my buckets */
    vm_lookup_val **bp = ext->buckets;
    size_t i = ext->bucket_cnt;
    for ( ; i != 0 ; ++bp, --i)
    {
        /* run through all entries attached to this bucket */
        for (const vm_lookup_val *entry = *bp ; entry != 0 ;
             entry = entry->nxt)
        {
            /* if the key is an object, mark it as referenced */
            val = &entry->key;
            if  (val->typ == VM_OBJ)
                G_obj_table->mark_all_refs(val->val.obj, state);

            /* if the entry is an object, mark it as referenced */
            val = &entry->val;
            if (val->typ == VM_OBJ)
                G_obj_table->mark_all_refs(val->val.obj, state);
        }
    }
}